

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

istream * operator>>(istream *stream,Msk4Header *header)

{
  int iVar1;
  runtime_error *this;
  Msk4HeaderSwitch h;
  
  iVar1 = detectSwitch(stream);
  if (-1 < iVar1) {
    readRaw<Msk4HeaderSwitch>(&h,stream);
    header->width = (uint16_t)h.width.value_;
    header->height = (uint16_t)h.height.value_;
    header->dataOffset = (uint32_t)h.dataOffset.value_;
    header->dataSize = (uint32_t)h.dataSize.value_;
    return stream;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"PS3 MSK4 decoding is unsupported");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::istream& operator>>(std::istream& stream, Msk4Header& header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		throw std::runtime_error("PS3 MSK4 decoding is unsupported");
	} else { // Switch
		auto h = readRaw<Msk4HeaderSwitch>(stream);
		header.width = h.width.value();
		header.height = h.height.value();
		header.dataOffset = h.dataOffset.value();
		header.dataSize = h.dataSize.value();
	}
	return stream;
}